

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

size_t pstore::utf::length<char_const*>(char *first,char *last)

{
  size_t sVar1;
  
  sVar1 = std::
          __count_if<char_const*,__gnu_cxx::__ops::_Iter_pred<pstore::utf::length<char_const*>(char_const*,char_const*)::_lambda(char)_1_>>
                    ();
  if (-1 < (long)sVar1) {
    return sVar1;
  }
  assert_failed("result >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                ,0x144);
}

Assistant:

auto length (Iterator first, Iterator last) -> std::size_t {
            auto const result =
                std::count_if (first, last, [] (char const c) { return is_utf_char_start (c); });
            PSTORE_ASSERT (result >= 0);
            using utype = typename std::make_unsigned<decltype (result)>::type;
            static_assert (std::numeric_limits<utype>::max () <=
                               std::numeric_limits<std::size_t>::max (),
                           "std::size_t cannot hold result of count_if");
            return static_cast<std::size_t> (result);
        }